

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

uint64_t CombinedShannonEntropy_C(uint32_t *X,uint32_t *Y)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long in_RSI;
  long in_RDI;
  uint32_t xy;
  uint32_t x;
  uint32_t sumXY;
  uint32_t sumX;
  uint64_t retval;
  int i;
  uint32_t in_stack_ffffffffffffffd4;
  undefined8 local_20;
  undefined4 local_14;
  
  local_20 = 0;
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    in_stack_ffffffffffffffd4 = *(uint32_t *)(in_RDI + (long)local_14 * 4);
    if (in_stack_ffffffffffffffd4 == 0) {
      if (*(int *)(in_RSI + (long)local_14 * 4) != 0) {
        uVar1 = VP8LFastSLog2(0);
        local_20 = uVar1 + local_20;
      }
    }
    else {
      uVar1 = VP8LFastSLog2(in_stack_ffffffffffffffd4);
      uVar2 = VP8LFastSLog2(in_stack_ffffffffffffffd4);
      local_20 = uVar2 + uVar1 + local_20;
    }
  }
  uVar1 = VP8LFastSLog2(in_stack_ffffffffffffffd4);
  uVar2 = VP8LFastSLog2(in_stack_ffffffffffffffd4);
  return (uVar1 + uVar2) - local_20;
}

Assistant:

static uint64_t CombinedShannonEntropy_C(const uint32_t X[256],
                                         const uint32_t Y[256]) {
  int i;
  uint64_t retval = 0;
  uint32_t sumX = 0, sumXY = 0;
  for (i = 0; i < 256; ++i) {
    const uint32_t x = X[i];
    if (x != 0) {
      const uint32_t xy = x + Y[i];
      sumX += x;
      retval += VP8LFastSLog2(x);
      sumXY += xy;
      retval += VP8LFastSLog2(xy);
    } else if (Y[i] != 0) {
      sumXY += Y[i];
      retval += VP8LFastSLog2(Y[i]);
    }
  }
  retval = VP8LFastSLog2(sumX) + VP8LFastSLog2(sumXY) - retval;
  return retval;
}